

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

opStatus __thiscall
llvm::APFloat::convertToInteger
          (APFloat *this,APSInt *result,roundingMode rounding_mode,bool *isExact)

{
  opStatus oVar1;
  undefined4 uVar2;
  bool IsSigned;
  uint uVar3;
  ArrayRef<unsigned_long> local_a0;
  APInt local_90;
  ArrayRef<unsigned_long> local_80;
  opStatus local_6c;
  unsigned_long uStack_68;
  opStatus status;
  undefined1 local_60 [8];
  SmallVector<unsigned_long,_4U> parts;
  uint bitWidth;
  bool *isExact_local;
  roundingMode rounding_mode_local;
  APSInt *result_local;
  APFloat *this_local;
  
  parts.super_SmallVectorStorage<unsigned_long,_4U>.InlineElts[3].super_AlignedCharArray<8UL,_8UL>.
  buffer._4_4_ = APInt::getBitWidth((APInt *)result);
  uVar3 = APInt::getNumWords((APInt *)result);
  uStack_68 = 0;
  SmallVector<unsigned_long,_4U>::SmallVector
            ((SmallVector<unsigned_long,_4U> *)local_60,(ulong)uVar3,&stack0xffffffffffffff98);
  MutableArrayRef<unsigned_long>::MutableArrayRef
            ((MutableArrayRef<unsigned_long> *)&local_80,(SmallVectorImpl<unsigned_long> *)local_60)
  ;
  uVar2 = parts.super_SmallVectorStorage<unsigned_long,_4U>.InlineElts[3].
          super_AlignedCharArray<8UL,_8UL>.buffer._4_4_;
  IsSigned = APSInt::isSigned(result);
  local_6c = convertToInteger(this,(MutableArrayRef<unsigned_long>)local_80,uVar2,IsSigned,
                              rounding_mode,isExact);
  uVar2 = parts.super_SmallVectorStorage<unsigned_long,_4U>.InlineElts[3].
          super_AlignedCharArray<8UL,_8UL>.buffer._4_4_;
  ArrayRef<unsigned_long>::ArrayRef<void>
            (&local_a0,(SmallVectorTemplateCommon<unsigned_long,_void> *)local_60);
  APInt::APInt(&local_90,uVar2,local_a0);
  APSInt::operator=(result,&local_90);
  APInt::~APInt(&local_90);
  oVar1 = local_6c;
  SmallVector<unsigned_long,_4U>::~SmallVector((SmallVector<unsigned_long,_4U> *)local_60);
  return oVar1;
}

Assistant:

APFloat::opStatus APFloat::convertToInteger(APSInt &result,
                                            roundingMode rounding_mode,
                                            bool *isExact) const {
  unsigned bitWidth = result.getBitWidth();
  SmallVector<uint64_t, 4> parts(result.getNumWords());
  opStatus status = convertToInteger(parts, bitWidth, result.isSigned(),
                                     rounding_mode, isExact);
  // Keeps the original signed-ness.
  result = APInt(bitWidth, parts);
  return status;
}